

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ostream *poVar5;
  stringstream *ss;
  int iVar6;
  undefined1 local_228 [8];
  char buffer [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  stringstream *local_40;
  allocator<char> local_32;
  char local_31 [8];
  char flag;
  
  do {
    sVar3 = read(this->read_fd_,local_31,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00118366;
      }
      if (iVar1 == 1) {
        if (local_31[0] == 'I') {
          iVar1 = this->read_fd_;
          Message::Message((Message *)&local_a8);
          local_40 = (stringstream *)local_a8._M_dataplus._M_p;
          goto LAB_0011849d;
        }
        if (local_31[0] == 'L') {
          this->outcome_ = LIVED;
        }
        else if (local_31[0] == 'T') {
          this->outcome_ = THREW;
        }
        else if (local_31[0] == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)local_228,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O2/source/tests/src/google-test-depends/googletest/src/gtest-death-test.cc"
                             ,0x1eb);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar5 = std::operator<<(poVar5,"unexpected status byte (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,")");
          GTestLog::~GTestLog((GTestLog *)local_228);
        }
        goto LAB_00118366;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_60,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O2/source/tests/src/google-test-depends/googletest/src/gtest-death-test.cc"
                     ,0x1f0);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar5,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  GTestLog::~GTestLog((GTestLog *)&local_60);
  goto LAB_00118366;
  while( true ) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    if (iVar6 != 4) break;
LAB_0011849d:
    while( true ) {
      sVar3 = read(iVar1,local_228,0xff);
      ss = local_40;
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      local_228[uVar2 & 0x7fffffff] = 0;
      std::operator<<((ostream *)(local_a8._M_dataplus._M_p + 0x10),local_228);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O2/source/tests/src/google-test-depends/googletest/src/gtest-death-test.cc"
                           ,0x168);
        StringStreamToString(&local_60,ss);
        std::operator<<((ostream *)&std::cerr,(string *)&local_60);
        goto LAB_00118604;
      }
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O2/source/tests/src/google-test-depends/googletest/src/gtest-death-test.cc"
                     ,0x16b);
  ss = local_40;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&local_60);
  poVar5 = std::operator<<(poVar5," [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  std::operator<<(poVar5,"]");
LAB_00118604:
  std::__cxx11::string::~string((string *)&local_60);
  GTestLog::~GTestLog((GTestLog *)&local_80);
  if (ss != (stringstream *)0x0) {
    (**(code **)(*(long *)ss + 8))(ss);
  }
LAB_00118366:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) goto LAB_0011844a;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CHECK failed: File ",&local_32);
  std::operator+(&local_108,&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O2/source/tests/src/google-test-depends/googletest/src/gtest-death-test.cc"
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_108,", line ");
  local_84 = 499;
  StreamableToString<int>(&local_c8,&local_84);
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_c8);
  std::operator+(&local_a8,&local_80,": ");
  std::operator+(&local_60,&local_a8,"posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 &local_60," != -1");
  DeathTestAbort((string *)local_228);
LAB_0011844a:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}